

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

size_t __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
GetNonEmptyHeapBlockCount
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,bool checkCount)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  Recycler *pRVar5;
  undefined4 *puVar6;
  ulong uStack_20;
  bool allocatingDuringConcurrentSweep;
  size_t currentHeapBlockCount;
  bool checkCount_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  sVar3 = HeapBlockList::
          Count<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->fullBlockList);
  sVar4 = HeapBlockList::
          Count<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                    (this->heapBlockList);
  uStack_20 = sVar4 + sVar3;
  pRVar5 = HeapBucket::GetRecycler(&this->super_HeapBucket);
  if ((pRVar5 != (Recycler *)0x0) &&
     (pRVar5 = HeapBucket::GetRecycler(&this->super_HeapBucket),
     pRVar5->recyclerSweepManager != (RecyclerSweepManager *)0x0)) {
    pRVar5 = HeapBucket::GetRecycler(&this->super_HeapBucket);
    sVar3 = RecyclerSweepManager::
            GetHeapBlockCount<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
                      (pRVar5->recyclerSweepManager,this);
    uStack_20 = sVar3 + uStack_20;
  }
  if ((checkCount) && ((this->super_HeapBucket).heapBlockCount != uStack_20)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1cc,
                       "(!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep))"
                       ,
                       "!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return uStack_20;
}

Assistant:

size_t
HeapBucketT<TBlockType>::GetNonEmptyHeapBlockCount(bool checkCount) const
{
    size_t currentHeapBlockCount = HeapBlockList::Count(fullBlockList);
    currentHeapBlockCount += HeapBlockList::Count(heapBlockList);
    bool allocatingDuringConcurrentSweep = false;

#if ENABLE_CONCURRENT_GC
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
#if SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        allocatingDuringConcurrentSweep = true;
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
        if (allocableHeapBlockListHead != nullptr)
        {
            currentHeapBlockCount += QueryDepthInterlockedSList(allocableHeapBlockListHead);
        }
        currentHeapBlockCount += HeapBlockList::Count(sweepableHeapBlockList);
        debugSweepableHeapBlockListLock.Leave();
    }
#endif
#endif

    // Recycler can be null if we have OOM in the ctor
    if (this->GetRecycler() && this->GetRecycler()->recyclerSweepManager != nullptr)
    {
        currentHeapBlockCount += this->GetRecycler()->recyclerSweepManager->GetHeapBlockCount(this);
    }
#endif

    // There is no way to determine the number of item in an SLIST if there are >= 65535 items in the list.
    RECYCLER_SLOW_CHECK(Assert(!checkCount || heapBlockCount == currentHeapBlockCount || (heapBlockCount >= 65535 && allocatingDuringConcurrentSweep)));

    return currentHeapBlockCount;
}